

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O3

void __thiscall
MarkdownHighlighter::highlightAdditionalRules
          (MarkdownHighlighter *this,QVector<HighlightingRule> *rules,QString *text)

{
  byte bVar1;
  pair<int,_int> *ppVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  QRegularExpressionMatchIterator iterator;
  QTextCharFormat currentMaskedFormat;
  QRegularExpressionMatch match;
  HighlightingRule *local_a8;
  QRegularExpressionMatchIterator local_a0 [8];
  QTextCharFormat *local_98;
  QString *local_90;
  HighlighterState *local_88;
  QTextFormat local_80 [16];
  HighlightingRule *local_70;
  QPodArrayOps<std::pair<int,int>> *local_68;
  QTextFormat *local_60;
  QRegularExpressionMatch local_58 [8];
  pair<int,_int> local_50 [4];
  
  local_50[0].first = 0x18;
  local_90 = text;
  local_60 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                        (&_formats,&local_50[0].first)->super_QTextFormat;
  local_68 = (QPodArrayOps<std::pair<int,int>> *)&this->_linkRanges;
  QList<std::pair<int,_int>_>::clear((QList<std::pair<int,_int>_> *)local_68);
  lVar9 = (rules->d).size;
  if (lVar9 != 0) {
    local_a8 = (rules->d).ptr;
    local_70 = local_a8 + lVar9;
    do {
      iVar4 = QSyntaxHighlighter::currentBlockState();
      if (iVar4 == -1) {
        lVar9 = QString::indexOf((QString *)local_90,(longlong)&local_a8->shouldContain,
                                 CaseInsensitive);
        if (lVar9 != -1) {
          QRegularExpression::globalMatch(local_a0,local_a8,local_90,0,0,0);
          bVar1 = local_a8->capturingGroup;
          local_88 = &local_a8->state;
          local_98 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                               (&_formats,local_88);
          while( true ) {
            cVar3 = QRegularExpressionMatchIterator::hasNext();
            if (cVar3 == '\0') break;
            QRegularExpressionMatchIterator::next();
            iVar4 = (int)local_58;
            if (bVar1 != 0) {
              QTextFormat::QTextFormat(local_80,local_60);
              dVar12 = (double)QTextFormat::doubleProperty((int)local_98);
              if (0.0 < dVar12) {
                dVar12 = (double)QTextFormat::doubleProperty((int)local_98);
                QVariant::QVariant((QVariant *)local_50,dVar12);
                QTextFormat::setProperty((int)local_80,(QVariant *)0x2001);
                QVariant::~QVariant((QVariant *)local_50);
              }
              iVar5 = QSyntaxHighlighter::currentBlockState();
              if (iVar5 < 0xc) {
LAB_00121f7d:
                if (*local_88 == Link) {
                  iVar5 = QRegularExpressionMatch::capturedStart(iVar4);
                  iVar6 = QRegularExpressionMatch::capturedStart(iVar4);
                  iVar7 = QRegularExpressionMatch::capturedLength(iVar4);
                  lVar9 = (this->_linkRanges).d.size;
                  if (0 < lVar9) {
                    ppVar2 = (this->_linkRanges).d.ptr;
                    lVar11 = 0;
                    do {
                      lVar10 = lVar11;
                      if (lVar9 * 8 - lVar10 == 0) goto LAB_00121feb;
                      lVar11 = lVar10 + 8;
                    } while ((*(int *)((long)&ppVar2->first + lVar10) != iVar5) ||
                            (*(int *)((long)&ppVar2->second + lVar10) != iVar7 + iVar6));
                    if (lVar11 != 0) goto LAB_00122001;
                  }
LAB_00121feb:
                  local_50[0].first = iVar5;
                  local_50[0].second = iVar7 + iVar6;
                  QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<std::pair<int,int>>
                            (local_68,lVar9,local_50);
                }
LAB_00122001:
                iVar5 = QRegularExpressionMatch::capturedStart(iVar4);
                uVar8 = QRegularExpressionMatch::capturedLength(iVar4);
                QSyntaxHighlighter::setFormat((int)this,iVar5,(QTextCharFormat *)(ulong)uVar8);
              }
              else {
                iVar5 = QSyntaxHighlighter::currentBlockState();
                if (0x11 < iVar5) goto LAB_00121f7d;
              }
              QTextFormat::~QTextFormat(local_80);
            }
            iVar5 = QSyntaxHighlighter::currentBlockState();
            if (iVar5 < 0xc) {
LAB_00122069:
              iVar5 = QRegularExpressionMatch::capturedStart(iVar4);
              uVar8 = QRegularExpressionMatch::capturedLength(iVar4);
              QSyntaxHighlighter::setFormat((int)this,iVar5,(QTextCharFormat *)(ulong)uVar8);
            }
            else {
              iVar5 = QSyntaxHighlighter::currentBlockState();
              if (0x11 < iVar5) goto LAB_00122069;
              setHeadingStyles(this,*local_88,local_58,(uint)bVar1);
            }
            QRegularExpressionMatch::~QRegularExpressionMatch(local_58);
          }
          QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(local_a0);
        }
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_70);
  }
  return;
}

Assistant:

void MarkdownHighlighter::highlightAdditionalRules(
    const QVector<HighlightingRule> &rules, const QString &text) {
    const auto &maskedFormat = _formats[HighlighterState::MaskedSyntax];
    _linkRanges.clear();

    for (const HighlightingRule &rule : rules) {
        // continue if another current block state was already set if
        // disableIfCurrentStateIsSet is set
        if (currentBlockState() != NoState) continue;

        const bool contains = text.contains(rule.shouldContain);
        if (!contains) continue;

        auto iterator = rule.pattern.globalMatch(text);
        const uint8_t capturingGroup = rule.capturingGroup;
        const uint8_t maskedGroup = rule.maskedGroup;
        const QTextCharFormat &format = _formats[rule.state];

        // find and format all occurrences
        while (iterator.hasNext()) {
            QRegularExpressionMatch match = iterator.next();

            // if there is a capturingGroup set then first highlight
            // everything as MaskedSyntax and highlight capturingGroup
            // with the real format
            if (capturingGroup > 0) {
                QTextCharFormat currentMaskedFormat = maskedFormat;
                // set the font size from the current rule's font format
                if (format.fontPointSize() > 0) {
                    currentMaskedFormat.setFontPointSize(
                        format.fontPointSize());
                }

                if (currentBlockState() >= H1 && currentBlockState() <= H6) {
                    // setHeadingStyles(format, match, maskedGroup);

                } else {
                    // store masked part of the link as a range
                    if (rule.state == Link) {
                        const int start = match.capturedStart(maskedGroup);
                        const int end = match.capturedStart(maskedGroup) +
                                        match.capturedLength(maskedGroup);
                        if (!_linkRanges.contains({start, end})) {
                            _linkRanges.append({start, end});
                        }
                    }

                    setFormat(match.capturedStart(maskedGroup),
                              match.capturedLength(maskedGroup),
                              currentMaskedFormat);
                }
            }
            if (currentBlockState() >= H1 && currentBlockState() <= H6) {
                setHeadingStyles(rule.state, match, capturingGroup);

            } else {
                setFormat(match.capturedStart(capturingGroup),
                          match.capturedLength(capturingGroup), format);
            }
        }
    }
}